

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.hpp
# Opt level: O3

void __thiscall duckdb::FixedDecimalStatistics::Update(FixedDecimalStatistics *this,hugeint_t *val)

{
  long lVar1;
  int64_t iVar2;
  long lVar3;
  ulong uVar4;
  
  lVar1 = (this->min).upper;
  uVar4 = val->lower;
  lVar3 = val->upper;
  if ((lVar3 < lVar1) || (uVar4 < (this->min).lower && lVar1 == lVar3)) {
    iVar2 = val->upper;
    (this->min).lower = val->lower;
    (this->min).upper = iVar2;
    uVar4 = val->lower;
    lVar3 = val->upper;
  }
  lVar1 = (this->max).upper;
  if ((lVar3 <= lVar1) && (uVar4 <= (this->max).lower || lVar3 != lVar1)) {
    return;
  }
  iVar2 = val->upper;
  (this->max).lower = val->lower;
  (this->max).upper = iVar2;
  return;
}

Assistant:

inline bool GreaterThan::Operation(const hugeint_t &left, const hugeint_t &right) {
	return Hugeint::GreaterThan(left, right);
}